

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O2

void vp8d_unref_frame(VP8DParserContext_t *p,VP8Frame *frame)

{
  char cVar1;
  RK_S32 index;
  undefined8 uVar2;
  MppBuffer framebuf;
  
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0xff,"vp8d_unref_frame"
              );
  }
  if (((frame == (VP8Frame *)0x0) || (frame->ref_count < '\x01')) ||
     (index = frame->slot_index, 0x7e < index)) {
    _mpp_log_l(2,"vp8d_parser","ref count alreay is zero",(char *)0x0);
    if (((byte)vp8d_debug & 1) == 0) {
      return;
    }
    uVar2 = 0x103;
  }
  else {
    cVar1 = frame->ref_count + -1;
    frame->ref_count = cVar1;
    if (cVar1 == '\0') {
      framebuf = (MppBuffer)0x0;
      if (frame->invisible != '\0') {
        mpp_buf_slot_get_prop(p->frame_slots,index,SLOT_BUFFER,&framebuf);
        mpp_buffer_put_with_caller(framebuf,"vp8d_unref_frame");
        frame->invisible = '\0';
        index = frame->slot_index;
      }
      mpp_buf_slot_clr_flag(p->frame_slots,index,SLOT_CODEC_USE);
      frame->slot_index = 0xff;
      mpp_frame_deinit(&frame->f);
      mpp_osal_free("vp8d_unref_frame",frame);
    }
    if (((byte)vp8d_debug & 1) == 0) {
      return;
    }
    uVar2 = 0x118;
  }
  _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",uVar2,"vp8d_unref_frame"
            );
  return;
}

Assistant:

static void vp8d_unref_frame(VP8DParserContext_t *p, VP8Frame *frame)
{

    FUN_T("FUN_IN");
    if (NULL == frame || frame->ref_count <= 0
        || frame->slot_index >= 0x7f) {
        mpp_err("ref count alreay is zero");
        FUN_T("FUN_OUT");
        return;
    }

    frame->ref_count--;
    if (!frame->ref_count) {
        if (frame->slot_index < 0x7f) {
            MppBuffer framebuf = NULL;
            if (frame->invisible) {
                mpp_buf_slot_get_prop(p->frame_slots, frame->slot_index, SLOT_BUFFER, &framebuf);
                mpp_buffer_put(framebuf);
                frame->invisible = 0;
            }
            mpp_buf_slot_clr_flag(p->frame_slots, frame->slot_index, SLOT_CODEC_USE);
        }
        frame->slot_index = 0xff;
        mpp_frame_deinit(&frame->f);
        mpp_free(frame);
        frame = NULL;
    }

    FUN_T("FUN_OUT");
    return;
}